

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

bool __thiscall cfd::core::Psbt::IsFinalized(Psbt *this)

{
  CfdException *this_00;
  int ret;
  size_t data;
  int local_4c;
  size_t local_48;
  undefined1 local_40 [32];
  
  local_48 = 0;
  local_4c = wally_psbt_is_finalized((wally_psbt *)this->wally_psbt_pointer_,&local_48);
  if (local_4c == 0) {
    return local_48 == 1;
  }
  local_40._0_8_ = "cfdcore_psbt.cpp";
  local_40._8_4_ = 0x802;
  local_40._16_8_ = "IsFinalized";
  logger::log<int&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                    "wally_psbt_is_finalized NG[{}]",&local_4c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"psbt check finalized error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool Psbt::IsFinalized() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t data = 0;
  int ret = wally_psbt_is_finalized(psbt_pointer, &data);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_is_finalized NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt check finalized error.");
  }
  return (data == 1);
}